

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-test.cc
# Opt level: O0

void __thiscall
TimeTest_FormatToEmptyContainer_Test::TestBody(TimeTest_FormatToEmptyContainer_Test *this)

{
  bool bVar1;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  file;
  type actual_expression;
  AssertHelper *this_00;
  AssertionResult gtest_ar;
  tm time;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  char (*in_stack_ffffffffffffff30) [3];
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  string *this_01;
  int line;
  Type in_stack_ffffffffffffff5c;
  AssertHelper *in_stack_ffffffffffffff60;
  tm *in_stack_ffffffffffffff68;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff70;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff78;
  Message *message;
  AssertHelper *this_02;
  string local_28 [40];
  
  this_01 = local_28;
  std::__cxx11::string::string(this_01);
  message = (Message *)0x0;
  this_02 = (AssertHelper *)0x0;
  file = std::back_inserter<std::__cxx11::string>(in_stack_ffffffffffffff28);
  actual_expression =
       fmt::v5::format_to<std::__cxx11::string,char[6],tm>
                 (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70.ptr_,in_stack_ffffffffffffff68
                 );
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[3]>
            ((char *)this_01,(char *)actual_expression.container,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),in_stack_ffffffffffffff30
            );
  line = (int)((ulong)this_01 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff68);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff60);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x10aef3)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(char *)file.container,line,
               (char *)actual_expression.container);
    testing::internal::AssertHelper::operator=(this_02,message);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x10af41);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10af81);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(TimeTest, FormatToEmptyContainer) {
  std::string s;
  auto time = std::tm();
  time.tm_sec = 42;
  fmt::format_to(std::back_inserter(s), "{:%S}", time);
  EXPECT_EQ(s, "42");
}